

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QDir::isReadable(QDir *this)

{
  FileCache *this_00;
  AtomicType copy;
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  uint uVar3;
  bool bVar4;
  
  pQVar1 = (this->d_ptr).d.ptr;
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (pQVar1->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
      (QAbstractFileEngine *)0x0) {
    uVar3 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0xb0))
                      (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                       0x4ffff);
    if ((uVar3 >> 0x12 & 1) == 0) {
      return false;
    }
    return (bool)((byte)(uVar3 >> 10) & 1);
  }
  this_00 = &pQVar1->fileCache;
  if ((__pointer_type)(pQVar1->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b ==
      (__pointer_type)0x0) {
    LOCK();
    bVar4 = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_002274af;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_002274af:
  if ((*(byte *)((long)&(pQVar1->fileCache).metaData.knownFlagsMask.
                        super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag> + 1) & 4) == 0) {
    QFileSystemEngine::fillMetaData
              (&pQVar1->dirEntry,&(pQVar1->fileCache).metaData,(MetaDataFlags)0x400);
  }
  uVar3 = (pQVar1->fileCache).metaData.entryFlags.
          super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  LOCK();
  copy._M_b._M_p = (pQVar1->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b;
  (pQVar1->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b = (__base_type)0x0;
  UNLOCK();
  if (copy._M_b._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,(void *)copy._M_b._M_p);
  }
  return (bool)((byte)(uVar3 >> 10) & 1);
}

Assistant:

constexpr P get() const noexcept { return ptr; }